

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O0

int IDAGetQuadNumRhsEvals(void *ida_mem,long *nrQevals)

{
  long *in_RSI;
  IDAMem in_RDI;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x68d,"IDAGetQuadNumRhsEvals",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RDI->ida_quadr == 0) {
    IDAProcessError(in_RDI,-0x1e,0x695,"IDAGetQuadNumRhsEvals",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"Illegal attempt to call before calling IDAQuadInit.");
    local_4 = -0x1e;
  }
  else {
    *in_RSI = in_RDI->ida_nrQe;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int IDAGetQuadNumRhsEvals(void* ida_mem, long int* nrQevals)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_quadr == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_QUAD, __LINE__, __func__, __FILE__,
                    MSG_NO_QUAD);
    return (IDA_NO_QUAD);
  }

  *nrQevals = IDA_mem->ida_nrQe;

  return (IDA_SUCCESS);
}